

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O3

void __thiscall si9ma::SinglyLinkedList::print_list(SinglyLinkedList *this,string *separator)

{
  SinglyNodeWithRand *pSVar1;
  ostream *poVar2;
  
  for (pSVar1 = this->head; pSVar1 != (SinglyNodeWithRand *)0x0; pSVar1 = pSVar1->next) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pSVar1->value);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(separator->_M_dataplus)._M_p,separator->_M_string_length);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return;
}

Assistant:

void SinglyLinkedList::print_list(string separator) {
        SinglyNodeWithRand *ptr = head;
        while (ptr != nullptr){
            std::cout << ptr->value << separator;
            ptr = ptr->next;
        }

        std::cout << std::endl;
    }